

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItemGroup::addToGroup(QGraphicsItemGroup *this,QGraphicsItem *item)

{
  bool bVar1;
  QGraphicsItemGroupPrivate *this_00;
  long lVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  QRectF *this_01;
  QGraphicsItemPrivate *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *this_02;
  qreal qVar5;
  QRectF *r;
  int i;
  QGraphicsItemGroupPrivate *d;
  QList<QGraphicsTransform_*> transformList;
  QPointF origin;
  bool ok;
  QMatrix4x4 m;
  QTransform newItemTransform;
  QTransform itemTransform;
  QGraphicsItem *in_stack_fffffffffffffc78;
  QMatrix4x4 *in_stack_fffffffffffffc80;
  QGraphicsItem *in_stack_fffffffffffffc88;
  QGraphicsItem *in_stack_fffffffffffffc90;
  undefined1 combine;
  QRectF *in_stack_fffffffffffffc98;
  QGraphicsItemPrivate *this_03;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  int iVar6;
  QGraphicsItemPrivate *newParent;
  QRectF local_330 [2];
  bool *in_stack_fffffffffffffd10;
  QGraphicsItem *in_stack_fffffffffffffd18;
  QGraphicsItem *in_stack_fffffffffffffd20;
  QRectF local_2d0;
  undefined1 local_2b0 [32];
  QList<QGraphicsTransform_*> local_290;
  QPointF local_278;
  QPointF local_268;
  QPointF local_258;
  char local_248 [39];
  byte local_221;
  char local_220 [32];
  char local_200 [112];
  undefined1 local_190 [84];
  undefined1 local_13c [68];
  undefined1 local_f8 [80];
  QTransform local_a8;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  newParent = in_RDI;
  this_00 = d_func((QGraphicsItemGroup *)0x977ec5);
  iVar6 = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  if (in_RSI == (QGraphicsItemPrivate *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,iVar6,
               (char *)in_stack_fffffffffffffc78);
    QMessageLogger::warning(local_200,"QGraphicsItemGroup::addToGroup: cannot add null item");
  }
  else if (in_RSI == in_RDI) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,iVar6,
               (char *)in_stack_fffffffffffffc78);
    QMessageLogger::warning
              (local_220,"QGraphicsItemGroup::addToGroup: cannot add a group to itself");
  }
  else {
    local_221 = 0xaa;
    memcpy(local_58,&DAT_00b422f8,0x50);
    QGraphicsItem::itemTransform
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    if ((local_221 & 1) == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                 (int)((ulong)in_stack_fffffffffffffc80 >> 0x20),(char *)in_stack_fffffffffffffc78);
      QMessageLogger::warning
                (local_248,
                 "QGraphicsItemGroup::addToGroup: could not find a valid transformation from item to group coordinates"
                );
    }
    else {
      memcpy(&local_a8,&DAT_00b42348,0x50);
      memcpy(&local_a8,local_58,0x50);
      this_03 = in_RSI;
      local_258 = QGraphicsItem::mapFromItem
                            ((QGraphicsItem *)this_00,
                             (QGraphicsItem *)
                             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             (qreal)in_RDI,(qreal)in_RSI);
      QGraphicsItem::setPos(in_stack_fffffffffffffc90,(QPointF *)in_stack_fffffffffffffc88);
      QGraphicsItem::setParentItem
                ((QGraphicsItem *)in_stack_fffffffffffffc98,(QGraphicsItem *)newParent);
      local_268 = QGraphicsItem::pos(in_stack_fffffffffffffc88);
      bVar1 = QPointF::isNull((QPointF *)in_stack_fffffffffffffc80);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        qVar5 = QGraphicsItem::x(in_stack_fffffffffffffc78);
        in_stack_fffffffffffffc98 = (QRectF *)((ulong)qVar5 ^ 0x8000000000000000);
        qVar5 = QGraphicsItem::y(in_stack_fffffffffffffc78);
        QTransform::fromTranslate((double)in_stack_fffffffffffffc98,-qVar5);
        QTransform::operator*=(&local_a8,(QTransform *)local_f8);
      }
      local_278.yp = -NAN;
      local_278.xp = -NAN;
      local_278 = QGraphicsItem::transformOriginPoint((QGraphicsItem *)in_stack_fffffffffffffc98);
      memcpy(local_13c,&DAT_00b42398,0x44);
      QMatrix4x4::QMatrix4x4(in_stack_fffffffffffffc80);
      local_290.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_290.d.ptr = (QGraphicsTransform **)&DAT_aaaaaaaaaaaaaaaa;
      local_290.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsItem::transformations(in_stack_fffffffffffffc88);
      iVar6 = 0;
      while( true ) {
        lVar2 = (long)iVar6;
        qVar3 = QList<QGraphicsTransform_*>::size(&local_290);
        if (qVar3 <= lVar2) break;
        ppQVar4 = QList<QGraphicsTransform_*>::at
                            ((QList<QGraphicsTransform_*> *)in_stack_fffffffffffffc80,
                             (qsizetype)in_stack_fffffffffffffc78);
        (**(code **)(*(long *)*ppQVar4 + 0x60))(*ppQVar4,local_13c);
        iVar6 = iVar6 + 1;
      }
      QMatrix4x4::toTransform();
      combine = (undefined1)((ulong)lVar2 >> 0x38);
      QTransform::inverted((bool *)local_190);
      QTransform::operator*=(&local_a8,(QTransform *)local_190);
      this_02 = (QGraphicsItem *)QPointF::x(&local_278);
      qVar5 = QPointF::y(&local_278);
      QTransform::translate((double)this_02,qVar5);
      qVar5 = QGraphicsItem::rotation(this_02);
      QTransform::rotate(-qVar5,(Axis)&local_a8);
      qVar5 = QGraphicsItem::scale(this_02);
      r = (QRectF *)(1.0 / qVar5);
      qVar5 = QGraphicsItem::scale(this_02);
      QTransform::scale((double)r,1.0 / qVar5);
      qVar5 = QPointF::x(&local_278);
      this_01 = (QRectF *)((ulong)qVar5 ^ 0x8000000000000000);
      qVar5 = QPointF::y(&local_278);
      QTransform::translate((double)this_01,-qVar5);
      QGraphicsItem::setTransform
                ((QGraphicsItem *)this_03,(QTransform *)in_stack_fffffffffffffc98,(bool)combine);
      QGraphicsItem::d_func((QGraphicsItem *)0x978356);
      QGraphicsItemPrivate::setIsMemberOfGroup
                (this_03,SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0));
      QGraphicsItem::prepareGeometryChange((QGraphicsItem *)newParent);
      (*in_RSI->_vptr_QGraphicsItemPrivate[3])(&stack0xfffffffffffffd10);
      QGraphicsItem::childrenBoundingRect((QGraphicsItem *)in_stack_fffffffffffffc98);
      QRectF::operator|(&local_2d0,(QRectF *)&stack0xfffffffffffffd10);
      QTransform::mapRect((QRectF *)local_2b0);
      QRectF::operator|=(this_01,r);
      QRectF::QRectF(local_330);
      QGraphicsItem::update((QGraphicsItem *)this_03,in_stack_fffffffffffffc98);
      QList<QGraphicsTransform_*>::~QList((QList<QGraphicsTransform_*> *)0x978405);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemGroup::addToGroup(QGraphicsItem *item)
{
    Q_D(QGraphicsItemGroup);
    if (!item) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add null item");
        return;
    }
    if (item == this) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add a group to itself");
        return;
    }

    // COMBINE
    bool ok;
    QTransform itemTransform = item->itemTransform(this, &ok);

    if (!ok) {
        qWarning("QGraphicsItemGroup::addToGroup: could not find a valid transformation from item to group coordinates");
        return;
    }

    QTransform newItemTransform(itemTransform);
    item->setPos(mapFromItem(item, 0, 0));
    item->setParentItem(this);

    // removing position from translation component of the new transform
    if (!item->pos().isNull())
        newItemTransform *= QTransform::fromTranslate(-item->x(), -item->y());

    // removing additional transformations properties applied with itemTransform()
    QPointF origin = item->transformOriginPoint();
    QMatrix4x4 m;
    QList<QGraphicsTransform*> transformList = item->transformations();
    for (int i = 0; i < transformList.size(); ++i)
        transformList.at(i)->applyTo(&m);
    newItemTransform *= m.toTransform().inverted();
    newItemTransform.translate(origin.x(), origin.y());
    newItemTransform.rotate(-item->rotation());
    newItemTransform.scale(1/item->scale(), 1/item->scale());
    newItemTransform.translate(-origin.x(), -origin.y());

    // ### Expensive, we could maybe use dirtySceneTransform bit for optimization

    item->setTransform(newItemTransform);
    item->d_func()->setIsMemberOfGroup(true);
    prepareGeometryChange();
    d->itemsBoundingRect |= itemTransform.mapRect(item->boundingRect() | item->childrenBoundingRect());
    update();
}